

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void net_uv::TCPSocket::uv_on_after_write(uv_write_t *req,int32_t status)

{
  undefined8 *__ptr;
  char *pcVar1;
  socket_send_buf *buf;
  int32_t status_local;
  uv_write_t *req_local;
  
  if (status != 0) {
    pcVar1 = uv_strerror(status);
    net_uvLog(3,"tcp write error %s",pcVar1);
  }
  __ptr = (undefined8 *)req->data;
  if (__ptr[3] != 0) {
    (*(code *)__ptr[3])(__ptr[2]);
  }
  free((void *)*__ptr);
  free(__ptr);
  free(req);
  return;
}

Assistant:

void TCPSocket::uv_on_after_write(uv_write_t* req, int32_t status)
{
	if (status != 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "tcp write error %s", uv_strerror(status));
	}
	socket_send_buf* buf = (socket_send_buf*)req->data;

	if (buf->call)
		buf->call(buf->userdata);

	fc_free(buf->base);
	fc_free(buf);
	fc_free(req);
}